

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O1

ParameterError secs2ms(long *valp,char *str)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  ParameterError PVar5;
  ulong uVar6;
  curl_off_t secs;
  char *local_38;
  long local_30;
  long local_28;
  
  PVar5 = PARAM_BAD_NUMERIC;
  if ((str != (char *)0x0) &&
     (local_38 = str, iVar3 = Curl_str_number(&local_38,&local_28,0x147ae147ae147ae), iVar3 == 0)) {
    iVar3 = Curl_str_single(&local_38,'.');
    pcVar2 = local_38;
    lVar4 = 0;
    if (iVar3 == 0) {
      iVar3 = Curl_str_number(&local_38,&local_30,0x7fffffffffffffff);
      if (iVar3 == 0) {
        uVar6 = (long)local_38 - (long)pcVar2;
        lVar4 = local_30;
        if (0x147ae147ae147ae < local_30 || 8 < uVar6) {
          do {
            lVar4 = local_30 / 10;
            uVar6 = uVar6 - 1;
            bVar1 = 0xcccccccccccccd5 < local_30;
            local_30 = lVar4;
          } while (bVar1 || 8 < uVar6);
        }
        lVar4 = (lVar4 * 100) / (long)(ulong)(uint)(&DAT_0012aabc)[uVar6];
      }
      else {
        lVar4 = 0;
      }
      if (iVar3 != 0) {
        return PARAM_NUMBER_TOO_LARGE;
      }
    }
    *valp = local_28 * 1000 + lVar4;
    PVar5 = PARAM_OK;
  }
  return PVar5;
}

Assistant:

ParameterError secs2ms(long *valp, const char *str)
{
  curl_off_t secs;
  long ms = 0;
  const unsigned int digs[] = { 1, 10, 100, 1000, 10000, 1000000,
    1000000, 10000000, 100000000 };
  if(!str ||
     curlx_str_number(&str, &secs, CURL_OFF_T_MAX/100))
    return PARAM_BAD_NUMERIC;
  if(!curlx_str_single(&str, '.')) {
    curl_off_t fracs;
    const char *s = str;
    size_t len;
    if(curlx_str_number(&str, &fracs, CURL_OFF_T_MAX))
      return PARAM_NUMBER_TOO_LARGE;
    /* how many milliseconds are in fracs ? */
    len = (str - s);
    while((len > sizeof(CURL_ARRAYSIZE(digs)) || (fracs > LONG_MAX/100))) {
      fracs /= 10;
      len--;
    }
    ms = ((long)fracs * 100) / digs[len - 1];
  }

  *valp = (long)secs * 1000 + ms;
  return PARAM_OK;
}